

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ServiceDescriptorTest_FindMethodByName_Test::
~ServiceDescriptorTest_FindMethodByName_Test(ServiceDescriptorTest_FindMethodByName_Test *this)

{
  (this->super_ServiceDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ServiceDescriptorTest_018e0f70;
  DescriptorPool::~DescriptorPool(&(this->super_ServiceDescriptorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

TEST_F(ServiceDescriptorTest, FindMethodByName) {
  EXPECT_EQ(foo_, service_->FindMethodByName("Foo"));
  EXPECT_EQ(bar_, service_->FindMethodByName("Bar"));
  EXPECT_EQ(foo2_, service2_->FindMethodByName("Foo"));
  EXPECT_EQ(baz2_, service2_->FindMethodByName("Baz"));

  EXPECT_TRUE(service_->FindMethodByName("NoSuchMethod") == nullptr);
  EXPECT_TRUE(service_->FindMethodByName("Baz") == nullptr);
  EXPECT_TRUE(service2_->FindMethodByName("Bar") == nullptr);
}